

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall
ASDCP::MXF::GenericStreamTextBasedSet::GenericStreamTextBasedSet
          (GenericStreamTextBasedSet *this,Dictionary *d)

{
  byte_t *value;
  UL local_38;
  Dictionary *local_18;
  Dictionary *d_local;
  GenericStreamTextBasedSet *this_local;
  
  local_18 = d;
  d_local = (Dictionary *)this;
  TextBasedObject::TextBasedObject(&this->super_TextBasedObject,d);
  (this->super_TextBasedObject).super_DescriptiveObject.super_InterchangeObject.super_KLVPacket.
  _vptr_KLVPacket = (_func_int **)&PTR__GenericStreamTextBasedSet_0033bba8;
  this->GenericStreamSID = 0;
  if ((this->super_TextBasedObject).super_DescriptiveObject.super_InterchangeObject.m_Dict !=
      (Dictionary *)0x0) {
    value = Dictionary::ul((this->super_TextBasedObject).super_DescriptiveObject.
                           super_InterchangeObject.m_Dict,MDD_GenericStreamTextBasedSet);
    UL::UL(&local_38,value);
    UL::operator=(&(this->super_TextBasedObject).super_DescriptiveObject.super_InterchangeObject.
                   super_KLVPacket.m_UL,&local_38);
    UL::~UL(&local_38);
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x1303,
                "ASDCP::MXF::GenericStreamTextBasedSet::GenericStreamTextBasedSet(const Dictionary *)"
               );
}

Assistant:

GenericStreamTextBasedSet::GenericStreamTextBasedSet(const Dictionary* d) : TextBasedObject(d), GenericStreamSID(0)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_GenericStreamTextBasedSet);
}